

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::FixStorageClass::PropagateStorageClass
          (FixStorageClass *this,Instruction *inst,StorageClass storage_class,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *seen)

{
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar1;
  Instruction *def;
  bool bVar2;
  Op OVar3;
  DefUseManager *this_00;
  reference ppIVar4;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar5;
  uint32_t local_c4;
  Instruction *local_c0;
  Instruction *use;
  iterator __end3;
  iterator __begin3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  function<void_(spvtools::opt::Instruction_*)> local_98;
  undefined1 local_78 [8];
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> uses;
  bool modified;
  uint32_t local_44;
  _Base_ptr local_40;
  byte local_38;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_30;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *seen_local;
  Instruction *pIStack_20;
  StorageClass storage_class_local;
  Instruction *inst_local;
  FixStorageClass *this_local;
  
  local_30 = seen;
  seen_local._4_4_ = storage_class;
  pIStack_20 = inst;
  inst_local = (Instruction *)this;
  bVar2 = IsPointerResultType(this,inst);
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_009beec8;
  }
  bVar2 = IsPointerToStorageClass(this,pIStack_20,seen_local._4_4_);
  if (bVar2) {
    OVar3 = opt::Instruction::opcode(pIStack_20);
    psVar1 = local_30;
    if (OVar3 == OpPhi) {
      local_44 = opt::Instruction::result_id(pIStack_20);
      pVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        (psVar1,&local_44);
      local_40 = (_Base_ptr)pVar5.first._M_node;
      local_38 = pVar5.second;
      if (((local_38 ^ 0xff) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_009beec8;
      }
    }
    uses.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)local_78);
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    def = pIStack_20;
    __range3 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)local_78;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::FixStorageClass::PropagateStorageClass(spvtools::opt::Instruction*,spv::StorageClass,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>*)::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_98,
               (anon_class_8_1_899298ca *)&__range3);
    analysis::DefUseManager::ForEachUser(this_00,def,&local_98);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_98);
    __end3 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)local_78);
    use = (Instruction *)
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )local_78);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                       *)&use), bVar2) {
      ppIVar4 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end3);
      local_c0 = *ppIVar4;
      bVar2 = PropagateStorageClass(this,local_c0,seen_local._4_4_,local_30);
      uses.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
           (uses.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0 || bVar2;
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end3);
    }
    OVar3 = opt::Instruction::opcode(pIStack_20);
    psVar1 = local_30;
    if (OVar3 == OpPhi) {
      local_c4 = opt::Instruction::result_id(pIStack_20);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::erase
                (psVar1,&local_c4);
    }
    this_local._7_1_ =
         uses.
         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1;
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            local_78);
    goto LAB_009beec8;
  }
  OVar3 = opt::Instruction::opcode(pIStack_20);
  if (OVar3 == OpFunctionCall) {
    this_local._7_1_ = 0;
    goto LAB_009beec8;
  }
  if (5 < OVar3 - OpVariable) {
    if ((OVar3 - OpAccessChain < 3) || (OVar3 == OpCopyObject)) {
LAB_009bee80:
      FixInstructionStorageClass(this,pIStack_20,seen_local._4_4_,local_30);
      this_local._7_1_ = 1;
      goto LAB_009beec8;
    }
    if (OVar3 != OpBitcast) {
      if ((OVar3 == OpSelect) || (OVar3 == OpPhi)) goto LAB_009bee80;
      if (OVar3 != OpAllocateNodePayloadsAMDX) {
        __assert_fail("false && \"Not expecting instruction to have a pointer result type.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                      ,0x6e,
                      "bool spvtools::opt::FixStorageClass::PropagateStorageClass(Instruction *, spv::StorageClass, std::set<uint32_t> *)"
                     );
      }
    }
  }
  this_local._7_1_ = 0;
LAB_009beec8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FixStorageClass::PropagateStorageClass(Instruction* inst,
                                            spv::StorageClass storage_class,
                                            std::set<uint32_t>* seen) {
  if (!IsPointerResultType(inst)) {
    return false;
  }

  if (IsPointerToStorageClass(inst, storage_class)) {
    if (inst->opcode() == spv::Op::OpPhi) {
      if (!seen->insert(inst->result_id()).second) {
        return false;
      }
    }

    bool modified = false;
    std::vector<Instruction*> uses;
    get_def_use_mgr()->ForEachUser(
        inst, [&uses](Instruction* use) { uses.push_back(use); });
    for (Instruction* use : uses) {
      modified |= PropagateStorageClass(use, storage_class, seen);
    }

    if (inst->opcode() == spv::Op::OpPhi) {
      seen->erase(inst->result_id());
    }
    return modified;
  }

  switch (inst->opcode()) {
    case spv::Op::OpAccessChain:
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpCopyObject:
    case spv::Op::OpPhi:
    case spv::Op::OpSelect:
      FixInstructionStorageClass(inst, storage_class, seen);
      return true;
    case spv::Op::OpFunctionCall:
      // We cannot be sure of the actual connection between the storage class
      // of the parameter and the storage class of the result, so we should not
      // do anything.  If the result type needs to be fixed, the function call
      // should be inlined.
      return false;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpLoad:
    case spv::Op::OpStore:
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
    case spv::Op::OpVariable:
    case spv::Op::OpBitcast:
    case spv::Op::OpAllocateNodePayloadsAMDX:
      // Nothing to change for these opcode.  The result type is the same
      // regardless of the storage class of the operand.
      return false;
    default:
      assert(false &&
             "Not expecting instruction to have a pointer result type.");
      return false;
  }
}